

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O2

int Cmd_CommandExecute(Abc_Frame_t *pAbc,char *sCommand)

{
  char cVar1;
  int iVar2;
  int loop;
  int argc;
  char **argv;
  int local_40;
  int local_3c;
  char **local_38;
  
  if ((pAbc->fAutoexac == 0) && (pAbc->fSource == 0)) {
    Cmd_HistoryAddCommand(pAbc,sCommand);
  }
  cVar1 = *sCommand;
  while( true ) {
    if ((cVar1 == '#') && (iVar2 = Cmd_CommandHandleSpecial(pAbc,sCommand), iVar2 != 0)) {
      return 0;
    }
    sCommand = CmdSplitLine(pAbc,sCommand,&local_3c,&local_38);
    local_40 = 0;
    iVar2 = CmdApplyAlias(pAbc,&local_3c,&local_38,&local_40);
    if (iVar2 == 0) {
      iVar2 = CmdCommandDispatch(pAbc,&local_3c,&local_38);
    }
    CmdFreeArgv(local_3c,local_38);
    if (iVar2 != 0) break;
    cVar1 = *sCommand;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int Cmd_CommandExecute( Abc_Frame_t * pAbc, const char * sCommand )
{
    int fStatus = 0, argc, loop;
    const char * sCommandNext;
    char **argv;

    if ( !pAbc->fAutoexac && !pAbc->fSource ) 
        Cmd_HistoryAddCommand(pAbc, sCommand);
    sCommandNext = sCommand;
    do 
    {
        if ( sCommandNext[0] == '#' && Cmd_CommandHandleSpecial( pAbc, sCommandNext ) )
            break;
        sCommandNext = CmdSplitLine( pAbc, sCommandNext, &argc, &argv );
        loop = 0;
        fStatus = CmdApplyAlias( pAbc, &argc, &argv, &loop );
        if ( fStatus == 0 ) 
            fStatus = CmdCommandDispatch( pAbc, &argc, &argv );
        CmdFreeArgv( argc, argv );
    } 
    while ( fStatus == 0 && *sCommandNext != '\0' );
    return fStatus;
}